

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O0

void __thiscall reverselock_tests::reverselock_basics::test_method(reverselock_basics *this)

{
  Mutex *_lock;
  lazy_ostream *plVar1;
  long in_FS_OFFSET;
  Mutex mutex;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  reverse_lock revlock4;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  reverse_lock *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  lazy_ostream *in_stack_fffffffffffffda8;
  const_string *in_stack_fffffffffffffdb0;
  const_string *pcVar2;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  int _line;
  char *_guardname;
  reverse_lock *in_stack_fffffffffffffde0;
  const_string local_208 [2];
  lazy_ostream local_1e8 [2];
  assertion_result local_1c8 [2];
  const_string local_190;
  assertion_result local_150 [2];
  const_string local_118 [2];
  assertion_result local_d8 [2];
  char local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _guardname = local_a0;
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd78);
  _lock = MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffd78);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffdb0,
             (char *)in_stack_fffffffffffffda8,
             (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd98 >> 0x18,0));
  do {
    pcVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
               (const_string *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (bool)in_stack_fffffffffffffd87);
    plVar1 = boost::unit_test::lazy_ostream::instance();
    _line = (int)((ulong)plVar1 >> 0x20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd78 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d8,(lazy_ostream *)&stack0xffffffffffffff08,local_118,0x13,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffdbf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffdbf);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (in_stack_fffffffffffffde0,(UniqueLock<AnnotatedMixin<std::mutex>_> *)_lock,_guardname,
             (char *)pcVar2,_line);
  do {
    pcVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               pcVar2,(size_t)in_stack_fffffffffffffda8,
               (const_string *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (bool)in_stack_fffffffffffffd87);
    in_stack_fffffffffffffda8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd78 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_150,(lazy_ostream *)&stack0xfffffffffffffe90,&local_190,0x16,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffda7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffda7);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(in_stack_fffffffffffffd98);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               pcVar2,(size_t)in_stack_fffffffffffffda8,
               (const_string *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (bool)in_stack_fffffffffffffd87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd78 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c8,local_1e8,local_208,0x18,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd8f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd8f);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffd78);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffd78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_basics)
{
    Mutex mutex;
    WAIT_LOCK(mutex, lock);

    BOOST_CHECK(lock.owns_lock());
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
    }
    BOOST_CHECK(lock.owns_lock());
}